

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  int *piVar3;
  ImGuiNextWindowData *pIVar4;
  ImGuiNavMoveResult *pIVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImGuiContextHook *pIVar8;
  ImFontAtlas *pIVar9;
  uint *puVar10;
  ImGuiWindow **ppIVar11;
  ImGuiPopupData *pIVar12;
  ImGuiGroupData *pIVar13;
  undefined1 auVar14 [12];
  byte bVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  ImGuiID IVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ImGuiID IVar23;
  ImGuiInputSource IVar24;
  ImGuiContext *ctx;
  uint *__dest;
  ImGuiWindow *pIVar25;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar26;
  int *piVar27;
  ImGuiGroupData *__dest_02;
  int i;
  int iVar28;
  ImGuiID IVar29;
  ImGuiWindow *window_00;
  char *pcVar30;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar31;
  ImGuiContext *g;
  int i_1;
  int iVar32;
  ImGuiDir IVar33;
  ImRect *pIVar34;
  ImGuiID IVar35;
  float *pfVar36;
  ImGuiNavLayer IVar37;
  ImGuiID IVar38;
  ImFont *font;
  float *pfVar39;
  long lVar40;
  long lVar41;
  ImGuiContext *g_2;
  ImGuiContext *pIVar42;
  ImGuiWindow *old_nav_window;
  ImGuiNavMoveResult *pIVar43;
  ImGuiWindow *window;
  long lVar44;
  bool *pbVar45;
  ImGuiContext *pIVar46;
  ImGuiContext *g_1;
  long lVar47;
  ulong uVar48;
  byte bVar49;
  uint uVar50;
  uint uVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  ImVec2 IVar55;
  float fVar62;
  ImVec2 IVar56;
  ImVec2 IVar57;
  ImVec2 IVar59;
  undefined1 auVar60 [16];
  double dVar58;
  undefined1 auVar61 [16];
  float fVar64;
  undefined1 auVar63 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ImRect local_48;
  
  pIVar16 = GImGui;
  bVar49 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xec5,"void ImGui::NewFrame()");
  }
  iVar32 = (GImGui->Hooks).Size;
  if (0 < iVar32) {
    lVar44 = 0;
    lVar47 = 0;
    do {
      pIVar8 = (pIVar16->Hooks).Data;
      if (*(int *)(pIVar8 + lVar44) == 0) {
        (**(code **)(pIVar8 + lVar44 + 8))(pIVar16,pIVar8 + lVar44);
        iVar32 = (pIVar16->Hooks).Size;
      }
      lVar47 = lVar47 + 1;
      lVar44 = lVar44 + 0x18;
    } while (lVar47 < iVar32);
  }
  pIVar46 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b32,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar32 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar32 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x1b33,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar32 != 0) && (GImGui->FrameCountEnded != iVar32)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b34,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b35,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar9 = (GImGui->IO).Fonts;
  if ((pIVar9->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b36,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar9->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b37,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b38,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b39,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar52 = (GImGui->Style).Alpha;
  if ((fVar52 < 0.0) || (1.0 < fVar52)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar44 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar44] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x1b3e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar44 = lVar44 + 1;
  } while (lVar44 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b42,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar46->SettingsLoaded == false) {
    if ((pIVar46->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x273b,"void ImGui::UpdateSettings()");
    }
    pcVar30 = (pIVar46->IO).IniFilename;
    if (pcVar30 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar30);
    }
    pIVar46->SettingsLoaded = true;
  }
  if ((0.0 < pIVar46->SettingsDirtyTimer) &&
     (fVar52 = pIVar46->SettingsDirtyTimer - (pIVar46->IO).DeltaTime,
     pIVar46->SettingsDirtyTimer = fVar52, fVar52 <= 0.0)) {
    pcVar30 = (pIVar46->IO).IniFilename;
    if (pcVar30 == (char *)0x0) {
      (pIVar46->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar30);
    }
    pIVar46->SettingsDirtyTimer = 0.0;
  }
  fVar52 = (pIVar16->IO).DeltaTime;
  pIVar16->Time = (double)fVar52 + pIVar16->Time;
  pIVar16->WithinFrameScope = true;
  pIVar16->FrameCount = pIVar16->FrameCount + 1;
  pIVar16->TooltipOverrideCount = 0;
  pIVar16->WindowsActiveCount = 0;
  if ((pIVar16->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar27 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar27 = *piVar27 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar10 = (pIVar16->MenusIdSubmittedThisFrame).Data;
    if (puVar10 != (uint *)0x0) {
      memcpy(__dest,puVar10,(long)(pIVar16->MenusIdSubmittedThisFrame).Size << 2);
      puVar10 = (pIVar16->MenusIdSubmittedThisFrame).Data;
      if ((puVar10 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar27 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar27 = *piVar27 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
    }
    (pIVar16->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar16->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar52 = (pIVar16->IO).DeltaTime;
  }
  pIVar46 = GImGui;
  (pIVar16->MenusIdSubmittedThisFrame).Size = 0;
  iVar32 = pIVar16->FramerateSecPerFrameIdx;
  pIVar16->FramerateSecPerFrameAccum =
       (fVar52 - pIVar16->FramerateSecPerFrame[iVar32]) + pIVar16->FramerateSecPerFrameAccum;
  pIVar16->FramerateSecPerFrame[iVar32] = fVar52;
  iVar28 = iVar32 + (int)((ulong)((long)(iVar32 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar16->FramerateSecPerFrameIdx = iVar32 + 1 + ((iVar28 >> 6) - (iVar28 >> 0x1f)) * -0x78;
  uVar50 = -(uint)(0.0 < pIVar16->FramerateSecPerFrameAccum);
  (pIVar16->IO).Framerate =
       (float)(~uVar50 & 0x7f7fffff |
              (uint)(1.0 / (pIVar16->FramerateSecPerFrameAccum / 120.0)) & uVar50);
  ((pIVar16->IO).Fonts)->Locked = true;
  font = (pIVar46->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar9 = (pIVar46->IO).Fonts;
    if ((pIVar9->Fonts).Size < 1) {
      pcVar30 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001785de:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                    ,0x658,pcVar30);
    }
    font = *(pIVar9->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar16->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xee0,"void ImGui::NewFrame()");
  }
  fVar52 = (pIVar16->IO).DisplaySize.x;
  fVar65 = (pIVar16->IO).DisplaySize.y;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.z = fVar52;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.w = fVar65;
  fVar52 = (pIVar16->Style).CircleSegmentMaxError;
  (pIVar16->DrawListSharedData).CurveTessellationTol = (pIVar16->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar16->DrawListSharedData,fVar52);
  bVar19 = (pIVar16->Style).AntiAliasedLines;
  uVar50 = (uint)bVar19;
  (pIVar16->DrawListSharedData).InitialFlags = (uint)bVar19;
  if (((pIVar16->Style).AntiAliasedLinesUseTex == true) &&
     ((pIVar16->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar50 = bVar19 | 2;
    (pIVar16->DrawListSharedData).InitialFlags = uVar50;
  }
  if ((pIVar16->Style).AntiAliasedFill == true) {
    uVar50 = uVar50 | 4;
    (pIVar16->DrawListSharedData).InitialFlags = uVar50;
  }
  if (((pIVar16->IO).BackendFlags & 8) != 0) {
    (pIVar16->DrawListSharedData).InitialFlags = uVar50 | 8;
  }
  pIVar1 = &pIVar16->BackgroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar16->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar16->ForegroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar16->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar16->DrawData).Valid = false;
  (pIVar16->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar16->DrawData).CmdListsCount = 0;
  (pIVar16->DrawData).TotalIdxCount = 0;
  (pIVar16->DrawData).TotalVtxCount = 0;
  (pIVar16->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar16->DrawData).DisplayPos.y = 0;
  (pIVar16->DrawData).DisplaySize.x = 0.0;
  (pIVar16->DrawData).DisplaySize.y = 0.0;
  (pIVar16->DrawData).FramebufferScale.x = 0.0;
  pIVar46 = GImGui;
  (pIVar16->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar16->DragDropActive == true) &&
     (IVar29 = (pIVar16->DragDropPayload).SourceId, IVar29 == pIVar16->ActiveId)) {
    if (GImGui->ActiveId == IVar29) {
      GImGui->ActiveIdIsAlive = IVar29;
    }
    if (pIVar46->ActiveIdPreviousFrame == IVar29) {
      pIVar46->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar16->HoveredIdPreviousFrame == 0) {
    IVar29 = pIVar16->HoveredId;
    pIVar16->HoveredIdTimer = 0.0;
    pIVar16->HoveredIdNotActiveTimer = 0.0;
    if (IVar29 == 0) goto LAB_00175a51;
LAB_00175a2a:
    fVar52 = (pIVar16->IO).DeltaTime;
    pIVar16->HoveredIdTimer = pIVar16->HoveredIdTimer + fVar52;
    IVar23 = IVar29;
    if (pIVar16->ActiveId != IVar29) {
      pIVar16->HoveredIdNotActiveTimer = fVar52 + pIVar16->HoveredIdNotActiveTimer;
      IVar23 = pIVar16->ActiveId;
    }
  }
  else {
    IVar29 = pIVar16->HoveredId;
    if (IVar29 != 0) {
      if (pIVar16->ActiveId == IVar29) {
        pIVar16->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00175a2a;
    }
LAB_00175a51:
    IVar29 = 0;
    IVar23 = pIVar16->ActiveId;
  }
  pIVar16->HoveredIdPreviousFrame = IVar29;
  pIVar16->HoveredIdPreviousFrameUsingMouseWheel = pIVar16->HoveredIdUsingMouseWheel;
  pIVar16->HoveredId = 0;
  pIVar16->HoveredIdAllowOverlap = false;
  pIVar16->HoveredIdUsingMouseWheel = false;
  pIVar16->HoveredIdDisabled = false;
  if (((pIVar16->ActiveIdIsAlive != IVar23) && (IVar23 != 0)) &&
     (pIVar16->ActiveIdPreviousFrame == IVar23)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar23 = pIVar16->ActiveId;
  }
  fVar52 = (pIVar16->IO).DeltaTime;
  if (IVar23 != 0) {
    pIVar16->ActiveIdTimer = pIVar16->ActiveIdTimer + fVar52;
  }
  pIVar16->LastActiveIdTimer = pIVar16->LastActiveIdTimer + fVar52;
  pIVar16->ActiveIdPreviousFrame = IVar23;
  pIVar16->ActiveIdPreviousFrameWindow = pIVar16->ActiveIdWindow;
  pIVar16->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar16->ActiveIdHasBeenEditedBefore;
  pIVar16->ActiveIdIsAlive = 0;
  pIVar16->ActiveIdHasBeenEditedThisFrame = false;
  pIVar16->ActiveIdPreviousFrameIsAlive = false;
  pIVar16->ActiveIdIsJustActivated = false;
  if (pIVar16->TempInputId == 0) {
LAB_00175b41:
    if (IVar23 == 0) {
      pIVar16->ActiveIdUsingNavDirMask = 0;
      pIVar16->ActiveIdUsingNavInputMask = 0;
      pIVar16->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar23 != pIVar16->TempInputId) {
    pIVar16->TempInputId = 0;
    goto LAB_00175b41;
  }
  pIVar16->DragDropAcceptIdPrev = pIVar16->DragDropAcceptIdCurr;
  pIVar16->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar16->DragDropAcceptIdCurr = 0;
  pIVar16->DragDropWithinSource = false;
  pIVar16->DragDropWithinTarget = false;
  pIVar16->DragDropHoldJustPressedId = 0;
  pIVar46 = GImGui;
  bVar19 = (GImGui->IO).KeyCtrl;
  uVar50 = bVar19 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar50 = (uint)bVar19;
  }
  uVar51 = uVar50 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar51 = uVar50;
  }
  uVar50 = uVar51 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar50 = uVar51;
  }
  (pIVar16->IO).KeyMods = uVar50;
  memcpy((pIVar16->IO).KeysDownDurationPrev,(pIVar16->IO).KeysDownDuration,0x800);
  lVar44 = 0x144;
  do {
    fVar65 = -1.0;
    if (*(char *)((long)(pIVar16->IO).KeyMap + lVar44 + -0x3c) == '\x01') {
      fVar64 = *(float *)((long)pIVar16 + lVar44 * 4 + -0x70);
      fVar65 = 0.0;
      if (0.0 <= fVar64) {
        fVar65 = fVar64 + fVar52;
      }
    }
    *(float *)((long)pIVar16 + lVar44 * 4 + -0x70) = fVar65;
    lVar44 = lVar44 + 1;
  } while (lVar44 != 0x344);
  (pIVar46->IO).WantSetMousePos = false;
  pIVar46->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar46->NavWrapRequestFlags = 0;
  uVar50 = (pIVar46->IO).ConfigFlags;
  if (((uVar50 & 2) == 0) || (((pIVar46->IO).BackendFlags & 1) == 0)) {
    bVar15 = 0;
  }
  else {
    bVar15 = 1;
    if ((pIVar46->NavInputSource != ImGuiInputSource_NavGamepad) &&
       (((bVar15 = 1, 0.0 < (pIVar46->IO).NavInputs[0] || (0.0 < (pIVar46->IO).NavInputs[2])) ||
        ((0.0 < (pIVar46->IO).NavInputs[1] ||
         ((((0.0 < (pIVar46->IO).NavInputs[3] || (0.0 < (pIVar46->IO).NavInputs[4])) ||
           (0.0 < (pIVar46->IO).NavInputs[5])) ||
          ((0.0 < (pIVar46->IO).NavInputs[6] || (0.0 < (pIVar46->IO).NavInputs[7])))))))))) {
      pIVar46->NavInputSource = ImGuiInputSource_NavGamepad;
    }
  }
  if ((uVar50 & 1) != 0) {
    uVar51 = (pIVar46->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar51) {
      if (0x1ff < uVar51) goto LAB_001785e8;
      if ((pIVar46->IO).KeysDown[(int)uVar51] == true) {
        (pIVar46->IO).NavInputs[0] = 1.0;
        pIVar46->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar51 = (pIVar46->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar51) {
      if (0x1ff < uVar51) goto LAB_001785e8;
      if ((pIVar46->IO).KeysDown[(int)uVar51] == true) {
        (pIVar46->IO).NavInputs[2] = 1.0;
        pIVar46->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar51 = (pIVar46->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar51) {
      if (0x1ff < uVar51) goto LAB_001785e8;
      if ((pIVar46->IO).KeysDown[(int)uVar51] == true) {
        (pIVar46->IO).NavInputs[1] = 1.0;
        pIVar46->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar51 = (pIVar46->IO).KeyMap[1];
    if (-1 < (long)(int)uVar51) {
      if (0x1ff < uVar51) goto LAB_001785e8;
      if ((pIVar46->IO).KeysDown[(int)uVar51] == true) {
        (pIVar46->IO).NavInputs[0x11] = 1.0;
        pIVar46->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar51 = (pIVar46->IO).KeyMap[2];
    if (-1 < (long)(int)uVar51) {
      if (0x1ff < uVar51) goto LAB_001785e8;
      if ((pIVar46->IO).KeysDown[(int)uVar51] == true) {
        (pIVar46->IO).NavInputs[0x12] = 1.0;
        pIVar46->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar51 = (pIVar46->IO).KeyMap[3];
    if (-1 < (long)(int)uVar51) {
      if (0x1ff < uVar51) goto LAB_001785e8;
      if ((pIVar46->IO).KeysDown[(int)uVar51] == true) {
        (pIVar46->IO).NavInputs[0x13] = 1.0;
        pIVar46->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar51 = (pIVar46->IO).KeyMap[4];
    if (-1 < (long)(int)uVar51) {
      if (0x1ff < uVar51) {
LAB_001785e8:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                      ,0x1185,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar46->IO).KeysDown[(int)uVar51] == true) {
        (pIVar46->IO).NavInputs[0x14] = 1.0;
        pIVar46->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar19 = (pIVar46->IO).KeyCtrl;
    if (bVar19 == true) {
      (pIVar46->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar46->IO).KeyShift == true) {
      (pIVar46->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar19 == false) && ((pIVar46->IO).KeyAlt != false)) {
      (pIVar46->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar46->IO).NavInputsDownDuration;
  pfVar36 = pfVar2;
  pfVar39 = (pIVar46->IO).NavInputsDownDurationPrev;
  for (lVar44 = 0x15; lVar44 != 0; lVar44 = lVar44 + -1) {
    *pfVar39 = *pfVar36;
    pfVar36 = pfVar36 + (ulong)bVar49 * -2 + 1;
    pfVar39 = pfVar39 + (ulong)bVar49 * -2 + 1;
  }
  lVar44 = 0;
  do {
    fVar52 = -1.0;
    if (0.0 < (pIVar46->IO).NavInputs[lVar44]) {
      fVar52 = 0.0;
      if (0.0 <= pfVar2[lVar44]) {
        fVar52 = pfVar2[lVar44] + (pIVar46->IO).DeltaTime;
      }
    }
    pfVar2[lVar44] = fVar52;
    lVar44 = lVar44 + 1;
  } while (lVar44 != 0x15);
  IVar29 = pIVar46->NavInitResultId;
  if ((IVar29 != 0) &&
     (((pIVar46->NavDisableHighlight != true || (pIVar46->NavInitRequestFromMove == true)) &&
      (pIVar46->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar37 = pIVar46->NavLayer;
    if (pIVar46->NavInitRequestFromMove == true) {
      SetNavID(IVar29,IVar37,0);
      IVar55 = (pIVar46->NavInitResultRectRel).Max;
      pIVar6 = &pIVar46->NavWindow->NavRectRel[(int)IVar37].Min;
      *pIVar6 = (pIVar46->NavInitResultRectRel).Min;
      pIVar6[1] = IVar55;
      pIVar46->NavMousePosDirty = true;
      pIVar46->NavDisableHighlight = false;
      pIVar46->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar29,IVar37,0);
    }
    IVar55 = (pIVar46->NavInitResultRectRel).Max;
    pIVar6 = &pIVar46->NavWindow->NavRectRel[pIVar46->NavLayer].Min;
    *pIVar6 = (pIVar46->NavInitResultRectRel).Min;
    pIVar6[1] = IVar55;
  }
  pIVar46->NavInitRequest = false;
  pIVar46->NavInitRequestFromMove = false;
  pIVar46->NavInitResultId = 0;
  pIVar46->NavJustMovedToId = 0;
  pIVar17 = GImGui;
  if (pIVar46->NavMoveRequest == true) {
    IVar29 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar29 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      pIVar42 = GImGui;
      if (GImGui->NavId == 0) goto LAB_001761d6;
    }
    else {
      pIVar5 = &GImGui->NavMoveResultOther;
      pIVar43 = &GImGui->NavMoveResultLocal;
      if (IVar29 == 0) {
        pIVar43 = pIVar5;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar29 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar29 != 0)) &&
         (IVar29 != GImGui->NavId)) {
        pIVar43 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar43 == pIVar5) {
LAB_001760a2:
        pIVar43 = pIVar5;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar52 = (GImGui->NavMoveResultOther).DistBox;
        fVar65 = pIVar43->DistBox;
        if (fVar65 <= fVar52) {
          if (((fVar52 != fVar65) || (NAN(fVar52) || NAN(fVar65))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar43->DistCenter < *pfVar2 || pIVar43->DistCenter == *pfVar2)) goto LAB_001760a5;
        }
        goto LAB_001760a2;
      }
LAB_001760a5:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar25 = pIVar43->Window, pIVar25 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                      ,0x2399,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar55 = (pIVar43->RectRel).Min;
          IVar56 = (pIVar43->RectRel).Max;
          fVar52 = (pIVar25->Pos).x;
          local_48.Min.x = IVar55.x + fVar52;
          fVar65 = (pIVar25->Pos).y;
          local_48.Min.y = IVar55.y + fVar65;
          local_48.Max.x = IVar56.x + fVar52;
          local_48.Max.y = IVar56.y + fVar65;
          IVar55 = ScrollToBringRectIntoView(pIVar43->Window,&local_48);
        }
        else {
          fVar52 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar52 = (pIVar25->ScrollMax).y;
          }
          IVar55 = (ImVec2)((ulong)(uint)((pIVar25->Scroll).y - fVar52) << 0x20);
          (pIVar25->ScrollTarget).y = fVar52;
          (pIVar25->ScrollTargetCenterRatio).y = 0.0;
          (pIVar25->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar52 = (pIVar43->RectRel).Min.y;
        fVar65 = (pIVar43->RectRel).Max.x;
        fVar64 = (pIVar43->RectRel).Max.y;
        (pIVar43->RectRel).Min.x = (pIVar43->RectRel).Min.x - IVar55.x;
        (pIVar43->RectRel).Min.y = fVar52 - IVar55.y;
        (pIVar43->RectRel).Max.x = fVar65 - IVar55.x;
        (pIVar43->RectRel).Max.y = fVar64 - IVar55.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar17->NavWindow = pIVar43->Window;
      IVar29 = pIVar43->ID;
      if (pIVar17->NavId == IVar29) {
        IVar23 = pIVar43->FocusScopeId;
      }
      else {
        pIVar17->NavJustMovedToId = IVar29;
        IVar23 = pIVar43->FocusScopeId;
        pIVar17->NavJustMovedToFocusScopeId = IVar23;
        pIVar17->NavJustMovedToKeyMods = pIVar17->NavMoveRequestKeyMods;
      }
      pIVar42 = GImGui;
      IVar37 = pIVar17->NavLayer;
      SetNavID(IVar29,IVar37,IVar23);
      IVar55 = (pIVar43->RectRel).Max;
      pIVar6 = &pIVar42->NavWindow->NavRectRel[(int)IVar37].Min;
      *pIVar6 = (pIVar43->RectRel).Min;
      pIVar6[1] = IVar55;
      pIVar42->NavMousePosDirty = true;
    }
    pIVar42->NavDisableHighlight = false;
    pIVar42->NavDisableMouseHover = true;
  }
LAB_001761d6:
  if (pIVar46->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar46->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2295,"void ImGui::NavUpdate()");
    }
    if (((pIVar46->NavMoveResultLocal).ID == 0) && ((pIVar46->NavMoveResultOther).ID == 0)) {
      pIVar46->NavDisableHighlight = false;
    }
    pIVar46->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar46->NavMousePosDirty == true) && (pIVar46->NavIdIsAlive == true)) {
    if ((((pIVar46->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar46->IO).BackendFlags & 4) != 0 && (pIVar46->NavDisableHighlight == false)) &&
         (pIVar46->NavDisableMouseHover == true)) && (pIVar46->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar55 = NavCalcPreferredRefPos();
      (pIVar46->IO).MousePosPrev = IVar55;
      (pIVar46->IO).MousePos = IVar55;
      (pIVar46->IO).WantSetMousePos = true;
    }
    pIVar46->NavMousePosDirty = false;
  }
  pIVar46->NavIdIsAlive = false;
  pIVar46->NavJustTabbedId = 0;
  IVar37 = pIVar46->NavLayer;
  if (ImGuiNavLayer_Menu < IVar37) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x22ab,"void ImGui::NavUpdate()");
  }
  pIVar25 = pIVar46->NavWindow;
  pIVar31 = pIVar25;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar31->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar31 != pIVar25) {
          pIVar31->NavLastChildNavWindow = pIVar25;
        }
        break;
      }
      ppIVar11 = &pIVar31->ParentWindow;
      pIVar31 = *ppIVar11;
    } while (*ppIVar11 != (ImGuiWindow *)0x0);
    if ((IVar37 == ImGuiNavLayer_Main) && (pIVar25->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar25->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar17 = GImGui;
  pIVar25 = GetTopMostPopupModal();
  if (pIVar25 != (ImGuiWindow *)0x0) {
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar17->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar52 = (pIVar17->IO).DeltaTime * -10.0 + pIVar17->NavWindowingHighlightAlpha;
    fVar52 = (float)(-(uint)(0.0 <= fVar52) & (uint)fVar52);
    pIVar17->NavWindowingHighlightAlpha = fVar52;
    if ((pIVar17->DimBgRatio <= 0.0) && (fVar52 <= 0.0)) {
      pIVar17->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar25 == (ImGuiWindow *)0x0) && (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar52 = (pIVar17->IO).NavInputsDownDuration[3];
    if (((pIVar17->IO).KeyCtrl == true) &&
       ((iVar32 = (pIVar17->IO).KeyMap[0], -1 < iVar32 &&
        (bVar19 = IsKeyPressed(iVar32,true), bVar19)))) {
      bVar49 = (byte)(pIVar17->IO).ConfigFlags;
      uVar51 = (uint)bVar49;
      if (fVar52 == 0.0 || (bVar49 & 1) != 0) {
LAB_001763fd:
        pIVar25 = pIVar17->NavWindow;
        if ((pIVar25 != (ImGuiWindow *)0x0) ||
           (pIVar25 = FindWindowNavFocusable((pIVar17->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar25 != (ImGuiWindow *)0x0)) {
          pIVar25 = pIVar25->RootWindow;
          pIVar17->NavWindowingTargetAnim = pIVar25;
          pIVar17->NavWindowingTarget = pIVar25;
          pIVar17->NavWindowingTimer = 0.0;
          pIVar17->NavWindowingHighlightAlpha = 0.0;
          pIVar17->NavWindowingToggleLayer = (bool)(~(byte)uVar51 & 1);
          pIVar17->NavInputSource = ImGuiInputSource_NavGamepad - (uVar51 & 1);
        }
      }
    }
    else if ((fVar52 == 0.0) && (!NAN(fVar52))) {
      uVar51 = 0;
      goto LAB_001763fd;
    }
  }
  fVar52 = (pIVar17->IO).DeltaTime + pIVar17->NavWindowingTimer;
  pIVar17->NavWindowingTimer = fVar52;
  if (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00176638:
    bVar19 = false;
    pIVar25 = (ImGuiWindow *)0x0;
  }
  else {
    IVar24 = pIVar17->NavInputSource;
    if (IVar24 != ImGuiInputSource_NavGamepad) {
LAB_001765a0:
      if (IVar24 == ImGuiInputSource_NavKeyboard) {
        fVar65 = (pIVar17->NavWindowingTimer + -0.2) / 0.05;
        fVar52 = 1.0;
        if (fVar65 <= 1.0) {
          fVar52 = fVar65;
        }
        fVar52 = (float)(~-(uint)(fVar65 < 0.0) & (uint)fVar52);
        uVar51 = -(uint)(fVar52 <= pIVar17->NavWindowingHighlightAlpha);
        pIVar17->NavWindowingHighlightAlpha =
             (float)(uVar51 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar51 & (uint)fVar52);
        iVar32 = (GImGui->IO).KeyMap[0];
        if ((-1 < iVar32) && (bVar19 = IsKeyPressed(iVar32,true), bVar19)) {
          NavUpdateWindowingHighlightWindow((pIVar17->IO).KeyShift - 1 | 1);
        }
        if ((pIVar17->IO).KeyCtrl == false) {
          pIVar25 = pIVar17->NavWindowingTarget;
          bVar19 = false;
          goto LAB_0017663d;
        }
      }
      goto LAB_00176638;
    }
    fVar65 = (fVar52 + -0.2) / 0.05;
    fVar52 = 1.0;
    if (fVar65 <= 1.0) {
      fVar52 = fVar65;
    }
    fVar52 = (float)(~-(uint)(fVar65 < 0.0) & (uint)fVar52);
    uVar51 = -(uint)(fVar52 <= pIVar17->NavWindowingHighlightAlpha);
    fVar64 = (float)(uVar51 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar51 & (uint)fVar52);
    pIVar17->NavWindowingHighlightAlpha = fVar64;
    fVar52 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar65 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar32 = (uint)(0.0 < fVar52) - (uint)(0.0 < fVar65);
    if (iVar32 != 0) {
      NavUpdateWindowingHighlightWindow(iVar32);
      pIVar17->NavWindowingHighlightAlpha = 1.0;
      fVar64 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00176638;
      IVar24 = pIVar17->NavInputSource;
      goto LAB_001765a0;
    }
    pbVar45 = &pIVar17->NavWindowingToggleLayer;
    *pbVar45 = (bool)(*pbVar45 & fVar64 < 1.0);
    if (*pbVar45 == false) {
      pIVar25 = pIVar17->NavWindowingTarget;
      bVar19 = false;
    }
    else {
      bVar19 = pIVar17->NavWindow != (ImGuiWindow *)0x0;
      pIVar25 = (ImGuiWindow *)0x0;
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0017663d:
  pIVar42 = GImGui;
  fVar52 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar52 == 0.0) && (!NAN(fVar52))) {
    pIVar17->NavWindowingToggleLayer = true;
  }
  if ((((pIVar17->ActiveId == 0) || (pIVar17->ActiveIdAllowOverlap == true)) && (fVar52 < 0.0)) &&
     ((pIVar17->NavWindowingToggleLayer != false &&
      (0.0 <= (pIVar42->IO).NavInputsDownDurationPrev[0x10])))) {
    bVar20 = IsMousePosValid(&(pIVar17->IO).MousePos);
    bVar21 = IsMousePosValid(&(pIVar17->IO).MousePosPrev);
    bVar19 = (bool)(bVar21 == bVar20 | bVar19);
  }
  pIVar31 = pIVar17->NavWindowingTarget;
  if ((pIVar31 != (ImGuiWindow *)0x0) && ((pIVar31->Flags & 4) == 0)) {
    IVar24 = pIVar17->NavInputSource;
    if ((IVar24 == ImGuiInputSource_NavGamepad) ||
       ((IVar55.x = 0.0, IVar55.y = 0.0, IVar24 == ImGuiInputSource_NavKeyboard &&
        (IVar24 = ImGuiInputSource_Mouse, (pIVar17->IO).KeyShift == false)))) {
      IVar55 = GetNavInputAmount2d(IVar24,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar52 = IVar55.y;
    if (((IVar55.x != 0.0) || (fVar52 != 0.0)) || (NAN(fVar52))) {
      fVar65 = (pIVar17->IO).DisplayFramebufferScale.x;
      fVar64 = (pIVar17->IO).DisplayFramebufferScale.y;
      if (fVar64 <= fVar65) {
        fVar65 = fVar64;
      }
      fVar65 = (float)(int)(fVar65 * (pIVar17->IO).DeltaTime * 800.0);
      pIVar31 = pIVar31->RootWindow;
      local_48.Min.x = (pIVar31->Pos).x + IVar55.x * fVar65;
      local_48.Min.y = (pIVar31->Pos).y + fVar52 * fVar65;
      SetWindowPos(pIVar31,&local_48.Min,1);
      if (((pIVar31->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar17->NavDisableMouseHover = true;
    }
  }
  if (pIVar25 != (ImGuiWindow *)0x0) {
    if ((pIVar17->NavWindow == (ImGuiWindow *)0x0) || (pIVar25 != pIVar17->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
      pIVar31 = pIVar25->NavLastChildNavWindow;
      if ((pIVar31 == (ImGuiWindow *)0x0) || (pIVar31->WasActive == false)) {
        pIVar31 = pIVar25;
      }
      ClosePopupsOverWindow(pIVar31,false);
      FocusWindow(pIVar31);
      if (pIVar31->NavLastIds[0] == 0) {
        NavInitWindow(pIVar31,false);
      }
      if ((pIVar31->DC).NavLayerActiveMask == 2) {
        pIVar17->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar19) && (pIVar25 = pIVar17->NavWindow, pIVar31 = pIVar25, pIVar25 != (ImGuiWindow *)0x0))
  {
    while (window_00 = pIVar31, window_00->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar31 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window_00 != pIVar25) {
      FocusWindow(window_00);
      window_00->NavLastChildNavWindow = pIVar25;
      pIVar25 = pIVar17->NavWindow;
    }
    pIVar17->NavDisableHighlight = false;
    pIVar17->NavDisableMouseHover = true;
    IVar37 = ImGuiNavLayer_Main;
    if (((pIVar25->DC).NavLayerActiveMask & 2) != 0) {
      IVar37 = pIVar17->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar37);
  }
  if (((bool)((uVar50 & 1) == 0 & (bVar15 ^ 1))) || (pIVar46->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar46->IO).NavActive = false;
LAB_0017691a:
    bVar19 = pIVar46->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar19 = (pIVar46->NavWindow->Flags & 0x40000U) == 0;
    (pIVar46->IO).NavActive = bVar19;
    if (((!bVar19) || (pIVar46->NavId == 0)) ||
       (bVar19 = true, pIVar46->NavDisableHighlight != false)) goto LAB_0017691a;
  }
  (pIVar46->IO).NavVisible = bVar19;
  fVar52 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar52 == 0.0) && (!NAN(fVar52))) {
    if (pIVar46->ActiveId == 0) {
      pIVar25 = pIVar46->NavWindow;
      if (((pIVar25 == (ImGuiWindow *)0x0) || ((pIVar25->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar25->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar32 = (pIVar46->OpenPopupStack).Size;
        if ((long)iVar32 < 1) {
          if (pIVar46->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x5000000U) != 0x1000000)) {
              pIVar25->NavLastIds[0] = 0;
            }
            pIVar46->NavId = 0;
            pIVar46->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar46->OpenPopupStack).Data[(long)iVar32 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar32 + -1,true);
        }
      }
      else {
        if (pIVar25->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                        ,0x22c8,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar25->ParentWindow);
        pIVar17 = GImGui;
        pIVar31 = GImGui->NavWindow;
        if (pIVar31 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                        ,0x20a7,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar29 = pIVar25->ChildId;
        GImGui->NavId = IVar29;
        pIVar17->NavFocusScopeId = 0;
        pIVar31->NavLastIds[0] = IVar29;
        pIVar46->NavIdIsAlive = false;
        if (pIVar46->NavDisableMouseHover == true) {
          pIVar46->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar46->NavActivateId = 0;
  pIVar46->NavActivateDownId = 0;
  pIVar46->NavActivatePressedId = 0;
  pIVar17 = GImGui;
  pIVar46->NavInputId = 0;
  IVar29 = pIVar46->NavId;
  IVar23 = 0;
  if ((IVar29 == 0) || (pIVar46->NavDisableHighlight != false)) {
    IVar35 = 0;
LAB_00176b20:
    pIVar25 = pIVar46->NavWindow;
    bVar19 = pIVar25 == (ImGuiWindow *)0x0;
    if ((!bVar19) && ((pIVar25->Flags & 0x40000) != 0)) {
      pIVar46->NavDisableHighlight = true;
    }
    if (IVar23 != IVar35 && IVar35 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x22f6,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar35 = 0;
    if (pIVar46->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00176b20;
    IVar23 = 0;
    if (pIVar46->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar46->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar52 = (GImGui->IO).NavInputsDownDuration[0];
          IVar18 = IVar29;
          if (0.0 <= fVar52) {
            IVar38 = pIVar46->ActiveId;
            if (IVar38 == 0 && fVar52 == 0.0) {
              pIVar46->NavActivateId = IVar29;
              pIVar46->NavActivateDownId = IVar29;
              IVar35 = IVar29;
            }
            else {
              if (IVar38 == 0) {
                pIVar46->NavActivateDownId = IVar29;
              }
              else {
                if (IVar38 != IVar29) goto LAB_00176f9a;
                pIVar46->NavActivateDownId = IVar29;
              }
              IVar35 = 0;
              if ((fVar52 != 0.0) || (IVar35 = 0, NAN(fVar52))) goto LAB_001782b4;
            }
            pIVar46->NavActivatePressedId = IVar29;
          }
          else {
            IVar38 = pIVar46->ActiveId;
            if ((IVar38 != 0) && (IVar38 != IVar29)) goto LAB_00176f9a;
            pIVar46->NavActivateDownId = IVar29;
            IVar35 = 0;
          }
        }
        else {
          IVar38 = pIVar46->ActiveId;
          if (IVar38 == 0) {
            IVar35 = 0;
            IVar18 = 0;
          }
          else {
LAB_00176f9a:
            IVar23 = 0;
            IVar35 = 0;
            IVar18 = 0;
            if (IVar38 != IVar29) goto LAB_00176b20;
          }
        }
LAB_001782b4:
        IVar23 = IVar18;
        fVar52 = (pIVar17->IO).NavInputsDownDuration[2];
        if ((fVar52 == 0.0) && (!NAN(fVar52))) {
          pIVar46->NavInputId = IVar29;
        }
      }
      goto LAB_00176b20;
    }
    bVar19 = true;
    pIVar25 = (ImGuiWindow *)0x0;
  }
  pIVar46->NavMoveRequest = false;
  IVar29 = pIVar46->NavNextActivateId;
  if (IVar29 != 0) {
    pIVar46->NavActivateId = IVar29;
    pIVar46->NavActivateDownId = IVar29;
    pIVar46->NavActivatePressedId = IVar29;
    pIVar46->NavInputId = IVar29;
  }
  pIVar46->NavNextActivateId = 0;
  if (pIVar46->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar46->NavMoveDir = -1;
    pIVar46->NavMoveRequestFlags = 0;
    IVar33 = -1;
    if (((!bVar19) && (pIVar46->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar25->Flags & 0x40000) == 0)) {
      uVar51 = GImGui->ActiveIdUsingNavDirMask;
      IVar33 = -1;
      if (((uVar51 & 1) == 0) &&
         ((fVar52 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar52 ||
          (fVar52 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar52)))) {
        pIVar46->NavMoveDir = 0;
        IVar33 = 0;
      }
      if (((uVar51 & 2) == 0) &&
         ((fVar52 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar52 ||
          (fVar52 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar52)))) {
        pIVar46->NavMoveDir = 1;
        IVar33 = 1;
      }
      if (((uVar51 & 4) == 0) &&
         ((fVar52 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar52 ||
          (fVar52 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar52)))) {
        pIVar46->NavMoveDir = 2;
        IVar33 = 2;
      }
      if (((uVar51 & 8) == 0) &&
         ((fVar52 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar52 ||
          (fVar52 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar52)))) {
        pIVar46->NavMoveDir = 3;
        IVar33 = 3;
      }
    }
    pIVar46->NavMoveClipDir = IVar33;
  }
  else {
    if ((pIVar46->NavMoveDir == -1) || (pIVar46->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2311,"void ImGui::NavUpdate()");
    }
    if (pIVar46->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2312,"void ImGui::NavUpdate()");
    }
    pIVar46->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar17 = GImGui;
  fVar52 = 0.0;
  if ((((((uVar50 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar25 = GImGui->NavWindow, pIVar25 != (ImGuiWindow *)0x0)) &&
      (((pIVar25->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar19 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar20 = false;
    bVar21 = false;
    if (bVar19) {
      bVar21 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar19 = IsKeyDown((pIVar17->IO).KeyMap[6]);
    if (bVar19) {
      bVar20 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar19 = IsKeyPressed((pIVar17->IO).KeyMap[7],true);
    if (bVar19) {
      bVar19 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar19 = false;
    }
    bVar22 = IsKeyPressed((pIVar17->IO).KeyMap[8],true);
    if (bVar22) {
      bVar22 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar22 = false;
    }
    fVar52 = 0.0;
    if ((bVar21 != bVar20) || (bVar19 != bVar22)) {
      if (((pIVar25->DC).NavLayerActiveMask == 0) && ((pIVar25->DC).NavHasScroll == true)) {
        bVar20 = IsKeyPressed((pIVar17->IO).KeyMap[5],true);
        if (bVar20) {
          fVar52 = (pIVar25->Scroll).y - ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y);
LAB_0017855c:
          (pIVar25->ScrollTarget).y = fVar52;
        }
        else {
          bVar20 = IsKeyPressed((pIVar17->IO).KeyMap[6],true);
          if (bVar20) {
            fVar52 = ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) + (pIVar25->Scroll).y
            ;
            goto LAB_0017855c;
          }
          if (bVar19 == false) {
            if (bVar22 == false) goto LAB_0017856f;
            fVar52 = (pIVar25->ScrollMax).y;
            goto LAB_0017855c;
          }
          (pIVar25->ScrollTarget).y = 0.0;
        }
        (pIVar25->ScrollTargetCenterRatio).y = 0.0;
        (pIVar25->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_0017856f:
        fVar52 = 0.0;
      }
      else {
        IVar37 = pIVar17->NavLayer;
        pIVar34 = pIVar25->NavRectRel + IVar37;
        fVar52 = GImGui->FontBaseSize * pIVar25->FontWindowScale;
        if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
          fVar52 = fVar52 * pIVar25->ParentWindow->FontWindowScale;
        }
        fVar52 = (pIVar25->NavRectRel[IVar37].Max.y - pIVar25->NavRectRel[IVar37].Min.y) +
                 (((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) - fVar52);
        fVar52 = (float)(~-(uint)(fVar52 <= 0.0) & (uint)fVar52);
        bVar20 = IsKeyPressed((pIVar17->IO).KeyMap[5],true);
        if (bVar20) {
          fVar52 = -fVar52;
          pIVar17->NavMoveDir = 3;
          pIVar17->NavMoveClipDir = 2;
          pIVar17->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar20 = IsKeyPressed((pIVar17->IO).KeyMap[6],true);
          if (!bVar20) {
            if (bVar19 == false) {
              fVar52 = 0.0;
              if (bVar22 != false) {
                fVar65 = ((pIVar25->ScrollMax).y + (pIVar25->SizeFull).y) - (pIVar25->Scroll).y;
                pIVar25->NavRectRel[IVar37].Max.y = fVar65;
                pIVar25->NavRectRel[IVar37].Min.y = fVar65;
                fVar65 = (pIVar34->Min).x;
                pIVar6 = &pIVar25->NavRectRel[IVar37].Max;
                if (pIVar6->x <= fVar65 && fVar65 != pIVar6->x) {
                  pIVar25->NavRectRel[IVar37].Max.x = 0.0;
                  (pIVar34->Min).x = 0.0;
                }
                pIVar17->NavMoveDir = 2;
                pIVar17->NavMoveRequestFlags = 0x50;
              }
              goto LAB_00176d3f;
            }
            fVar52 = -(pIVar25->Scroll).y;
            pIVar25->NavRectRel[IVar37].Max.y = fVar52;
            pIVar25->NavRectRel[IVar37].Min.y = fVar52;
            fVar52 = (pIVar34->Min).x;
            pIVar6 = &pIVar25->NavRectRel[IVar37].Max;
            if (pIVar6->x <= fVar52 && fVar52 != pIVar6->x) {
              pIVar25->NavRectRel[IVar37].Max.x = 0.0;
              (pIVar34->Min).x = 0.0;
            }
            pIVar17->NavMoveDir = 3;
            pIVar17->NavMoveRequestFlags = 0x50;
            goto LAB_0017856f;
          }
          pIVar17->NavMoveDir = 2;
          pIVar17->NavMoveClipDir = 3;
          pIVar17->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_00176d3f:
  uVar50 = pIVar46->NavMoveDir;
  if (uVar50 == 0xffffffff) {
    bVar49 = pIVar46->NavMoveRequest;
    if ((bVar49 & 1) != 0) goto LAB_00176d7c;
    bVar19 = false;
  }
  else {
    pIVar46->NavMoveRequest = true;
    pIVar46->NavMoveRequestKeyMods = (pIVar46->IO).KeyMods;
    pIVar46->NavMoveDirLast = uVar50;
    bVar49 = 1;
LAB_00176d7c:
    bVar19 = true;
    if (pIVar46->NavId == 0) {
      pIVar46->NavInitRequest = true;
      pIVar46->NavInitRequestFromMove = true;
      pIVar46->NavInitResultId = 0;
      pIVar46->NavDisableHighlight = false;
    }
  }
  pIVar17 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar45 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar45;
    if (*pbVar45 != false) goto LAB_00176e96;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00176e96:
    if (pIVar17->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2201,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar25 = pIVar46->NavWindow;
  if (((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x40000) == 0)) &&
     (pIVar46->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar65 = pIVar17->FontBaseSize * pIVar25->FontWindowScale;
    if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
      fVar65 = fVar65 * pIVar25->ParentWindow->FontWindowScale;
    }
    fVar65 = (float)(int)(fVar65 * 100.0 * (pIVar46->IO).DeltaTime + 0.5);
    if (((pIVar25->DC).NavLayerActiveMask == 0) && ((bVar49 & (pIVar25->DC).NavHasScroll) == 1)) {
      if (uVar50 < 2) {
        lVar44 = 0x7c;
        lVar47 = 0x74;
        lVar40 = 0x6c;
        lVar41 = 0x5c;
        uVar51 = 0;
      }
      else {
        if ((uVar50 & 0xfffffffe) != 2) goto LAB_00177040;
        lVar44 = 0x80;
        lVar47 = 0x78;
        lVar40 = 0x70;
        uVar51 = 2;
        lVar41 = 0x60;
      }
      *(float *)((long)&pIVar25->Name + lVar40) =
           (float)(int)(*(float *)(&DAT_001bbcb4 + (ulong)(uVar50 == uVar51) * 4) * fVar65 +
                       *(float *)((long)&pIVar25->Name + lVar41));
      *(undefined4 *)((long)&pIVar25->Name + lVar47) = 0;
      *(undefined4 *)((long)&pIVar25->Name + lVar44) = 0;
    }
LAB_00177040:
    IVar55 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar64 = IVar55.x;
    fVar53 = IVar55.y;
    if (((fVar64 != 0.0) || (NAN(fVar64))) && (pIVar25->ScrollbarX == true)) {
      (pIVar25->ScrollTarget).x = (float)(int)(fVar64 * fVar65 + (pIVar25->Scroll).x);
      (pIVar25->ScrollTargetCenterRatio).x = 0.0;
      (pIVar25->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar53 != 0.0) || (NAN(fVar53))) {
      (pIVar25->ScrollTarget).y = (float)(int)(fVar53 * fVar65 + (pIVar25->Scroll).y);
      (pIVar25->ScrollTargetCenterRatio).y = 0.0;
      (pIVar25->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar46->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar46->NavMoveResultLocal).ID = 0;
  (pIVar46->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar46->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar46->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar46->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar46->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar46->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar46->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar46->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar46->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar46->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar46->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar46->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar46->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar46->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar46->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar46->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar46->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar46->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar46->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar46->NavMoveResultOther).ID = 0;
  (pIVar46->NavMoveResultOther).FocusScopeId = 0;
  (pIVar46->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar46->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar46->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar46->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar46->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar46->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar46->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar19) && (pIVar46->NavInputSource == ImGuiInputSource_NavGamepad)) &&
     (pIVar46->NavLayer == ImGuiNavLayer_Main)) {
    fVar65 = (pIVar25->Pos).x;
    fVar64 = (pIVar25->Pos).y;
    auVar70._0_4_ = ((pIVar25->InnerRect).Min.x - fVar65) + -1.0;
    auVar70._4_4_ = ((pIVar25->InnerRect).Min.y - fVar64) + -1.0;
    auVar70._8_4_ = ((pIVar25->InnerRect).Max.x - fVar65) + 1.0;
    auVar70._12_4_ = ((pIVar25->InnerRect).Max.y - fVar64) + 1.0;
    if (((pIVar25->NavRectRel[0].Min.x < auVar70._0_4_) ||
        (pIVar25->NavRectRel[0].Min.y < auVar70._4_4_)) ||
       ((auVar70._8_4_ < pIVar25->NavRectRel[0].Max.x ||
        (auVar70._12_4_ < pIVar25->NavRectRel[0].Max.y)))) {
      fVar65 = pIVar17->FontBaseSize * pIVar25->FontWindowScale;
      if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
        fVar65 = fVar65 * pIVar25->ParentWindow->FontWindowScale;
      }
      auVar66._0_4_ = fVar65 * 0.5;
      auVar63._0_4_ = auVar70._8_4_ - auVar70._0_4_;
      auVar63._4_4_ = auVar70._12_4_ - auVar70._4_4_;
      auVar63._8_4_ = auVar70._8_4_ - auVar70._8_4_;
      auVar63._12_4_ = auVar70._12_4_ - auVar70._12_4_;
      auVar66._4_4_ = auVar66._0_4_;
      auVar66._8_4_ = auVar66._0_4_;
      auVar66._12_4_ = auVar66._0_4_;
      auVar63 = minps(auVar63,auVar66);
      local_48.Min.x = auVar63._0_4_ + auVar70._0_4_;
      local_48.Min.y = auVar63._4_4_ + auVar70._4_4_;
      auVar14._4_8_ = auVar70._8_8_;
      auVar14._0_4_ = auVar70._4_4_ - auVar66._0_4_;
      auVar60._0_8_ = auVar14._0_8_ << 0x20;
      auVar60._8_4_ = auVar70._8_4_ - auVar63._0_4_;
      auVar60._12_4_ = auVar70._12_4_ - auVar63._4_4_;
      local_48.Max = auVar60._8_8_;
      ImRect::ClipWithFull(pIVar25->NavRectRel,&local_48);
      pIVar46->NavId = 0;
      pIVar46->NavFocusScopeId = 0;
      pIVar25 = pIVar46->NavWindow;
    }
  }
  if (pIVar25 == (ImGuiWindow *)0x0) {
    fVar65 = (GImGui->IO).DisplaySize.x;
    fVar64 = (GImGui->IO).DisplaySize.y;
    fVar53 = 0.0;
    fVar62 = 0.0;
  }
  else {
    IVar55 = pIVar25->NavRectRel[pIVar46->NavLayer].Min;
    IVar56 = pIVar25->NavRectRel[pIVar46->NavLayer].Max;
    fVar65 = (pIVar25->Pos).x;
    fVar53 = IVar55.x + fVar65;
    fVar64 = (pIVar25->Pos).y;
    fVar62 = IVar55.y + fVar64;
    fVar65 = IVar56.x + fVar65;
    fVar64 = IVar56.y + fVar64;
  }
  (pIVar46->NavScoringRect).Min.y = fVar62 + fVar52;
  (pIVar46->NavScoringRect).Max.y = fVar64 + fVar52;
  fVar54 = fVar53 + 1.0;
  if (fVar65 <= fVar53 + 1.0) {
    fVar54 = fVar65;
  }
  (pIVar46->NavScoringRect).Min.x = fVar54;
  (pIVar46->NavScoringRect).Max.x = fVar54;
  if (fVar64 + fVar52 < fVar62 + fVar52) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x2361,"void ImGui::NavUpdate()");
  }
  pIVar46->NavScoringCount = 0;
  pIVar46 = GImGui;
  pIVar6 = &(GImGui->IO).MousePos;
  bVar19 = IsMousePosValid(pIVar6);
  if (bVar19) {
    IVar55 = (pIVar46->IO).MousePos;
    IVar56.x = (float)(int)IVar55.x;
    IVar56.y = (float)(int)IVar55.y;
    pIVar46->LastValidMousePos = IVar56;
    (pIVar46->IO).MousePos = IVar56;
  }
  bVar19 = IsMousePosValid(pIVar6);
  if ((bVar19) && (bVar19 = IsMousePosValid(&(pIVar46->IO).MousePosPrev), bVar19)) {
    IVar55 = (pIVar46->IO).MousePos;
    IVar56 = (pIVar46->IO).MousePosPrev;
    IVar57.x = IVar55.x - IVar56.x;
    IVar57.y = IVar55.y - IVar56.y;
    (pIVar46->IO).MouseDelta = IVar57;
    if ((((IVar57.x != 0.0) || (NAN(IVar57.x))) || (IVar57.y != 0.0)) || (NAN(IVar57.y))) {
      pIVar46->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar46->IO).MouseDelta.x = 0.0;
    (pIVar46->IO).MouseDelta.y = 0.0;
  }
  (pIVar46->IO).MousePosPrev = (pIVar46->IO).MousePos;
  lVar44 = 0;
  do {
    if ((pIVar46->IO).MouseDown[lVar44] == true) {
      fVar52 = (pIVar46->IO).MouseDownDuration[lVar44];
      pbVar45 = (pIVar46->IO).MouseClicked + lVar44;
      *pbVar45 = fVar52 < 0.0;
      pbVar45[10] = false;
      (pIVar46->IO).MouseDownDurationPrev[lVar44] = fVar52;
      if (0.0 <= fVar52) {
        (pIVar46->IO).MouseDownDuration[lVar44] = fVar52 + (pIVar46->IO).DeltaTime;
        (pIVar46->IO).MouseDoubleClicked[lVar44] = false;
        bVar19 = IsMousePosValid(pIVar6);
        auVar61 = ZEXT816(0);
        if (bVar19) {
          IVar55 = (pIVar46->IO).MousePos;
          IVar56 = (pIVar46->IO).MouseClickedPos[lVar44];
          auVar61._0_4_ = IVar55.x - IVar56.x;
          auVar61._4_4_ = IVar55.y - IVar56.y;
          auVar61._8_8_ = 0;
        }
        fVar52 = (pIVar46->IO).MouseDragMaxDistanceSqr[lVar44];
        fVar65 = auVar61._0_4_ * auVar61._0_4_ + auVar61._4_4_ * auVar61._4_4_;
        uVar50 = -(uint)(fVar65 <= fVar52);
        (pIVar46->IO).MouseDragMaxDistanceSqr[lVar44] =
             (float)(~uVar50 & (uint)fVar65 | (uint)fVar52 & uVar50);
        IVar55 = (pIVar46->IO).MouseDragMaxDistanceAbs[lVar44];
        auVar67._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
        auVar67._8_4_ = auVar61._8_4_ ^ 0x80000000;
        auVar67._12_4_ = auVar61._12_4_ ^ 0x80000000;
        auVar70 = maxps(auVar67,auVar61);
        fVar52 = IVar55.x;
        fVar65 = IVar55.y;
        uVar50 = -(uint)(auVar70._0_4_ <= fVar52);
        uVar51 = -(uint)(auVar70._4_4_ <= fVar65);
        pIVar7 = (pIVar46->IO).MouseDragMaxDistanceAbs + lVar44;
        pIVar7->x = (float)(~uVar50 & (uint)auVar70._0_4_ | (uint)fVar52 & uVar50);
        pIVar7->y = (float)(~uVar51 & (uint)auVar70._4_4_ | (uint)fVar65 & uVar51);
      }
      else {
        (pIVar46->IO).MouseDownDuration[lVar44] = 0.0;
        (pIVar46->IO).MouseDoubleClicked[lVar44] = false;
        dVar58 = pIVar46->Time;
        if ((float)(dVar58 - (pIVar46->IO).MouseClickedTime[lVar44]) <
            (pIVar46->IO).MouseDoubleClickTime) {
          bVar19 = IsMousePosValid(pIVar6);
          fVar52 = 0.0;
          fVar65 = 0.0;
          if (bVar19) {
            IVar55 = (pIVar46->IO).MousePos;
            IVar56 = (pIVar46->IO).MouseClickedPos[lVar44];
            fVar52 = IVar55.x - IVar56.x;
            fVar65 = IVar55.y - IVar56.y;
          }
          fVar64 = (pIVar46->IO).MouseDoubleClickMaxDist;
          if (fVar52 * fVar52 + fVar65 * fVar65 < fVar64 * fVar64) {
            (pIVar46->IO).MouseDoubleClicked[lVar44] = true;
          }
          dVar58 = (double)((pIVar46->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar46->IO).MouseClickedTime[lVar44] = dVar58;
        (pIVar46->IO).MouseClickedPos[lVar44] = (pIVar46->IO).MousePos;
        (pIVar46->IO).MouseDownWasDoubleClick[lVar44] = (pIVar46->IO).MouseDoubleClicked[lVar44];
        pIVar7 = (pIVar46->IO).MouseDragMaxDistanceAbs + lVar44;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar46->IO).MouseDragMaxDistanceSqr[lVar44] = 0.0;
      }
    }
    else {
      (pIVar46->IO).MouseClicked[lVar44] = false;
      fVar52 = (pIVar46->IO).MouseDownDuration[lVar44];
      (pIVar46->IO).MouseReleased[lVar44] = 0.0 <= fVar52;
      pbVar45 = (pIVar46->IO).MouseClicked + lVar44;
      (pIVar46->IO).MouseDownDurationPrev[lVar44] = fVar52;
      (pIVar46->IO).MouseDownDuration[lVar44] = -1.0;
      (pIVar46->IO).MouseDoubleClicked[lVar44] = false;
    }
    if (((pIVar46->IO).MouseDown[lVar44] == false) && ((pIVar46->IO).MouseReleased[lVar44] == false)
       ) {
      (pIVar46->IO).MouseDownWasDoubleClick[lVar44] = false;
    }
    if (*pbVar45 == true) {
      pIVar46->NavDisableMouseHover = false;
    }
    lVar44 = lVar44 + 1;
  } while (lVar44 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar25 = GetTopMostPopupModal();
  if ((pIVar25 != (ImGuiWindow *)0x0) ||
     ((pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar16->NavWindowingHighlightAlpha)))) {
    fVar52 = (pIVar16->IO).DeltaTime * 6.0 + pIVar16->DimBgRatio;
    if (1.0 <= fVar52) {
      fVar52 = 1.0;
    }
    pIVar16->DimBgRatio = fVar52;
  }
  else {
    fVar52 = (pIVar16->IO).DeltaTime * -10.0 + pIVar16->DimBgRatio;
    pIVar16->DimBgRatio = (float)(-(uint)(0.0 <= fVar52) & (uint)fVar52);
  }
  pIVar16->MouseCursor = 0;
  pIVar16->WantTextInputNextFrame = -1;
  pIVar16->WantCaptureMouseNextFrame = -1;
  pIVar16->WantCaptureKeyboardNextFrame = -1;
  (pIVar16->PlatformImePos).x = 1.0;
  pIVar46 = GImGui;
  (pIVar16->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar19 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar19) &&
        (fVar52 = (pIVar46->IO).MouseDragThreshold,
        fVar65 = (pIVar46->IO).MousePos.x - (pIVar46->WheelingWindowRefMousePos).x,
        fVar64 = (pIVar46->IO).MousePos.y - (pIVar46->WheelingWindowRefMousePos).y,
        fVar52 * fVar52 < fVar65 * fVar65 + fVar64 * fVar64)) ||
       (pIVar46->WheelingWindowTimer <= 0.0)) {
      pIVar46->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar46->WheelingWindowTimer = 0.0;
    }
  }
  pIVar17 = GImGui;
  fVar52 = (pIVar46->IO).MouseWheel;
  if (((((fVar52 != 0.0) || (fVar65 = (pIVar46->IO).MouseWheelH, fVar65 != 0.0)) || (NAN(fVar65)))
      && ((pIVar46->ActiveId == 0 || (pIVar46->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar46->HoveredIdPreviousFrame == 0 ||
       (pIVar46->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar25 = pIVar46->WheelingWindow, pIVar25 != (ImGuiWindow *)0x0 ||
        (pIVar25 = pIVar46->HoveredWindow, pIVar25 != (ImGuiWindow *)0x0)) &&
       (pIVar25->Collapsed == false)))))) {
    if ((fVar52 != 0.0) || (NAN(fVar52))) {
      if ((pIVar46->IO).KeyCtrl == true) {
        if ((pIVar46->IO).FontAllowUserScaling == true) {
          if (GImGui->WheelingWindow != pIVar25) {
            GImGui->WheelingWindow = pIVar25;
            pIVar17->WheelingWindowRefMousePos = (pIVar17->IO).MousePos;
            pIVar17->WheelingWindowTimer = 2.0;
            fVar52 = (pIVar46->IO).MouseWheel;
          }
          fVar65 = pIVar25->FontWindowScale;
          fVar64 = fVar52 * 0.1 + fVar65;
          fVar52 = 2.5;
          if (fVar64 <= 2.5) {
            fVar52 = fVar64;
          }
          fVar52 = (float)(-(uint)(fVar64 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar64 < 0.5) & (uint)fVar52);
          pIVar25->FontWindowScale = fVar52;
          if ((pIVar25->Flags & 0x1000000) == 0) {
            fVar52 = fVar52 / fVar65;
            IVar55 = pIVar25->Size;
            auVar68._8_8_ = 0;
            auVar68._0_4_ = IVar55.x;
            auVar68._4_4_ = IVar55.y;
            IVar56 = (pIVar46->IO).MousePos;
            fVar65 = (pIVar25->Pos).x;
            fVar64 = (pIVar25->Pos).y;
            auVar69._0_4_ = (IVar56.x - fVar65) * (1.0 - fVar52) * IVar55.x;
            auVar69._4_4_ = (IVar56.y - fVar64) * (1.0 - fVar52) * IVar55.y;
            auVar69._8_8_ = 0;
            auVar70 = divps(auVar69,auVar68);
            local_48.Min.x = auVar70._0_4_ + fVar65;
            local_48.Min.y = auVar70._4_4_ + fVar64;
            SetWindowPos(pIVar25,&local_48.Min,0);
            IVar55 = pIVar25->SizeFull;
            IVar59.x = (float)(int)((pIVar25->Size).x * fVar52);
            IVar59.y = (float)(int)((pIVar25->Size).y * fVar52);
            pIVar25->Size = IVar59;
            (pIVar25->SizeFull).x = (float)(int)(IVar55.x * fVar52);
            (pIVar25->SizeFull).y = (float)(int)(IVar55.y * fVar52);
          }
          goto LAB_0017779a;
        }
      }
      else if ((pIVar46->IO).KeyShift == false) {
        if (GImGui->WheelingWindow != pIVar25) {
          GImGui->WheelingWindow = pIVar25;
          pIVar17->WheelingWindowRefMousePos = (pIVar17->IO).MousePos;
          pIVar17->WheelingWindowTimer = 2.0;
        }
        uVar50 = pIVar25->Flags;
        while (((uVar50 >> 0x18 & 1) != 0 &&
               (((uVar50 & 0x210) == 0x10 ||
                ((fVar65 = (pIVar25->ScrollMax).y, fVar65 == 0.0 && (!NAN(fVar65)))))))) {
          pIVar25 = pIVar25->ParentWindow;
          uVar50 = pIVar25->Flags;
        }
        if ((uVar50 & 0x210) == 0) {
          fVar65 = ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) * 0.67;
          fVar64 = pIVar17->FontBaseSize * pIVar25->FontWindowScale;
          if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
            fVar64 = fVar64 * pIVar25->ParentWindow->FontWindowScale;
          }
          fVar53 = fVar64 * 5.0;
          if (fVar65 <= fVar64 * 5.0) {
            fVar53 = fVar65;
          }
          (pIVar25->ScrollTarget).y = (pIVar25->Scroll).y - fVar52 * (float)(int)fVar53;
          (pIVar25->ScrollTargetCenterRatio).y = 0.0;
          (pIVar25->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
    }
    pIVar17 = GImGui;
    fVar52 = (pIVar46->IO).MouseWheelH;
    if (((fVar52 == 0.0) && (!NAN(fVar52))) || ((pIVar46->IO).KeyShift == true)) {
      fVar52 = (pIVar46->IO).MouseWheel;
      if (((fVar52 == 0.0) && (!NAN(fVar52))) || ((pIVar46->IO).KeyShift != true))
      goto LAB_0017779a;
    }
    if ((pIVar46->IO).KeyCtrl == false) {
      if (GImGui->WheelingWindow != pIVar25) {
        GImGui->WheelingWindow = pIVar25;
        pIVar17->WheelingWindowRefMousePos = (pIVar17->IO).MousePos;
        pIVar17->WheelingWindowTimer = 2.0;
      }
      uVar50 = pIVar25->Flags;
      while (((uVar50 >> 0x18 & 1) != 0 &&
             (((uVar50 & 0x210) == 0x10 ||
              ((fVar65 = (pIVar25->ScrollMax).x, fVar65 == 0.0 && (!NAN(fVar65)))))))) {
        pIVar25 = pIVar25->ParentWindow;
        uVar50 = pIVar25->Flags;
      }
      if ((uVar50 & 0x210) == 0) {
        fVar65 = ((pIVar25->InnerRect).Max.x - (pIVar25->InnerRect).Min.x) * 0.67;
        fVar64 = pIVar17->FontBaseSize * pIVar25->FontWindowScale;
        if (pIVar25->ParentWindow != (ImGuiWindow *)0x0) {
          fVar64 = fVar64 * pIVar25->ParentWindow->FontWindowScale;
        }
        fVar53 = fVar64 + fVar64;
        if (fVar65 <= fVar64 + fVar64) {
          fVar53 = fVar65;
        }
        (pIVar25->ScrollTarget).x = (pIVar25->Scroll).x - fVar52 * (float)(int)fVar53;
        (pIVar25->ScrollTargetCenterRatio).x = 0.0;
        (pIVar25->ScrollTargetEdgeSnapDist).x = 0.0;
      }
    }
  }
LAB_0017779a:
  pIVar46 = GImGui;
  pIVar25 = GImGui->NavWindow;
  if ((((pIVar25 == (ImGuiWindow *)0x0) || (pIVar25->Active != true)) ||
      ((pIVar25->Flags & 0x40000) != 0)) ||
     (((GImGui->IO).KeyCtrl != false || (iVar32 = (GImGui->IO).KeyMap[0], iVar32 < 0)))) {
    GImGui->FocusTabPressed = false;
LAB_0017783d:
    pIVar25 = pIVar46->FocusRequestNextWindow;
  }
  else {
    bVar19 = IsKeyPressed(iVar32,true);
    pIVar46->FocusTabPressed = bVar19;
    if ((!bVar19) || (pIVar46->ActiveId != 0)) goto LAB_0017783d;
    pIVar25 = pIVar46->NavWindow;
    pIVar46->FocusRequestNextWindow = pIVar25;
    pIVar46->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar46->NavId == 0) || (pIVar46->NavIdTabCounter == 0x7fffffff)) {
      iVar32 = -(uint)(pIVar46->IO).KeyShift;
    }
    else {
      iVar32 = pIVar46->NavIdTabCounter + (-(uint)(pIVar46->IO).KeyShift | 1) + 1;
    }
    pIVar46->FocusRequestNextCounterTabStop = iVar32;
  }
  pIVar46->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar46->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar46->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    pIVar46->FocusRequestCurrWindow = pIVar25;
    if ((pIVar46->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar32 = (pIVar25->DC).FocusCounterRegular, iVar32 != -1)) {
      pIVar46->FocusRequestCurrCounterRegular =
           (pIVar46->FocusRequestNextCounterRegular + iVar32 + 1) % (iVar32 + 1);
    }
    if ((pIVar46->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar32 = (pIVar25->DC).FocusCounterTabStop, iVar32 != -1)) {
      pIVar46->FocusRequestCurrCounterTabStop =
           (pIVar46->FocusRequestNextCounterTabStop + iVar32 + 1) % (iVar32 + 1);
    }
    pIVar46->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar46->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar46->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar46->NavIdTabCounter = 0x7fffffff;
  uVar50 = (pIVar16->WindowsFocusOrder).Size;
  if (uVar50 != (pIVar16->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xf50,"void ImGui::NewFrame()");
  }
  fVar52 = 3.4028235e+38;
  if ((pIVar16->GcCompactAll == false) &&
     (fVar65 = (pIVar16->IO).ConfigMemoryCompactTimer, 0.0 <= fVar65)) {
    fVar52 = (float)pIVar16->Time - fVar65;
  }
  if (uVar50 != 0) {
    uVar48 = 0;
    do {
      if ((long)(int)uVar50 <= (long)uVar48) {
        pcVar30 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001785de;
      }
      pIVar25 = (pIVar16->Windows).Data[uVar48];
      bVar19 = pIVar25->Active;
      pIVar25->WasActive = bVar19;
      pIVar25->BeginCount = 0;
      pIVar25->Active = false;
      pIVar25->WriteAccessed = false;
      if (((bVar19 == false) && (pIVar25->MemoryCompacted == false)) &&
         (pIVar25->LastTimeActive <= fVar52 && fVar52 != pIVar25->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar25);
        uVar50 = (pIVar16->Windows).Size;
      }
      uVar48 = uVar48 + 1;
    } while (uVar48 != uVar50);
  }
  iVar32 = (pIVar16->TablesLastTimeActive).Size;
  if (0 < iVar32) {
    lVar44 = 0;
    lVar47 = 0;
    do {
      fVar65 = (pIVar16->TablesLastTimeActive).Data[lVar47];
      if ((0.0 <= fVar65) && (fVar65 < fVar52)) {
        if ((pIVar16->Tables).Buf.Size <= lVar47) {
          pcVar30 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_001785de;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar16->Tables).Buf.Data)->ID + lVar44));
        iVar32 = (pIVar16->TablesLastTimeActive).Size;
      }
      lVar47 = lVar47 + 1;
      lVar44 = lVar44 + 0x250;
    } while (lVar47 < iVar32);
  }
  if (pIVar16->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar16->GcCompactAll = false;
  if ((pIVar16->NavWindow != (ImGuiWindow *)0x0) && (pIVar16->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar16->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar27 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar27 = *piVar27 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar11 = (pIVar16->CurrentWindowStack).Data;
    if (ppIVar11 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar11,(long)(pIVar16->CurrentWindowStack).Size << 3);
      ppIVar11 = (pIVar16->CurrentWindowStack).Data;
      if ((ppIVar11 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar27 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar27 = *piVar27 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
    }
    (pIVar16->CurrentWindowStack).Data = __dest_00;
    (pIVar16->CurrentWindowStack).Capacity = 0;
  }
  (pIVar16->CurrentWindowStack).Size = 0;
  if ((pIVar16->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar27 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar27 = *piVar27 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar12 = (pIVar16->BeginPopupStack).Data;
    if (pIVar12 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar12,(long)(pIVar16->BeginPopupStack).Size * 0x30);
      pIVar12 = (pIVar16->BeginPopupStack).Data;
      if ((pIVar12 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar27 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar27 = *piVar27 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar12,GImAllocatorUserData);
    }
    (pIVar16->BeginPopupStack).Data = __dest_01;
    (pIVar16->BeginPopupStack).Capacity = 0;
  }
  (pIVar16->BeginPopupStack).Size = 0;
  iVar32 = (pIVar16->ItemFlagsStack).Capacity;
  if (iVar32 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar27 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar27 = *piVar27 + 1;
    }
    piVar26 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar27 = (pIVar16->ItemFlagsStack).Data;
    if (piVar27 != (int *)0x0) {
      memcpy(piVar26,piVar27,(long)(pIVar16->ItemFlagsStack).Size << 2);
      piVar27 = (pIVar16->ItemFlagsStack).Data;
      if ((piVar27 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar3 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar3 = *piVar3 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar27,GImAllocatorUserData);
    }
    (pIVar16->ItemFlagsStack).Data = piVar26;
    (pIVar16->ItemFlagsStack).Size = 0;
    (pIVar16->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar16->ItemFlagsStack).Size = 0;
    if (iVar32 != 0) {
      piVar27 = (pIVar16->ItemFlagsStack).Data;
      lVar44 = 0;
      goto LAB_00177c97;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar27 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar27 = *piVar27 + 1;
  }
  piVar27 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar26 = (pIVar16->ItemFlagsStack).Data;
  if (piVar26 != (int *)0x0) {
    memcpy(piVar27,piVar26,(long)(pIVar16->ItemFlagsStack).Size << 2);
    piVar26 = (pIVar16->ItemFlagsStack).Data;
    if ((piVar26 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar3 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar3 = *piVar3 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar26,GImAllocatorUserData);
  }
  (pIVar16->ItemFlagsStack).Data = piVar27;
  (pIVar16->ItemFlagsStack).Capacity = 8;
  lVar44 = (long)(pIVar16->ItemFlagsStack).Size;
LAB_00177c97:
  piVar27[lVar44] = 0;
  (pIVar16->ItemFlagsStack).Size = (pIVar16->ItemFlagsStack).Size + 1;
  if ((pIVar16->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar27 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar27 = *piVar27 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar13 = (pIVar16->GroupStack).Data;
    if (pIVar13 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar13,(long)(pIVar16->GroupStack).Size * 0x30);
      pIVar13 = (pIVar16->GroupStack).Data;
      if ((pIVar13 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar27 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar27 = *piVar27 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
    }
    (pIVar16->GroupStack).Data = __dest_02;
    (pIVar16->GroupStack).Capacity = 0;
  }
  (pIVar16->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar16->NavWindow,false);
  pIVar46 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar46->DebugItemPickerActive == true) {
    uVar50 = pIVar46->HoveredIdPreviousFrame;
    pIVar46->MouseCursor = 7;
    iVar32 = (pIVar46->IO).KeyMap[0xe];
    if ((-1 < iVar32) && (bVar19 = IsKeyPressed(iVar32,true), bVar19)) {
      pIVar46->DebugItemPickerActive = false;
    }
    pIVar17 = GImGui;
    fVar52 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar52 != 0.0) || (NAN(fVar52))) {
      uVar51 = (uint)(uVar50 == 0);
    }
    else if (uVar50 == 0) {
      uVar51 = 1;
    }
    else {
      pIVar46->DebugItemPickerBreakId = uVar50;
      pIVar46->DebugItemPickerActive = false;
      uVar51 = 0;
    }
    pIVar4 = &pIVar17->NextWindowData;
    *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
    (pIVar17->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar50);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar51 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar46 = GImGui;
  }
  pIVar16->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar46->NextWindowData).Flags = (byte)(pIVar46->NextWindowData).Flags | 2;
  (pIVar46->NextWindowData).SizeVal.x = 400.0;
  (pIVar46->NextWindowData).SizeVal.y = 400.0;
  (pIVar46->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar16->CurrentWindow->IsFallbackWindow != false) {
    iVar32 = (pIVar16->Hooks).Size;
    if (0 < iVar32) {
      lVar44 = 0;
      lVar47 = 0;
      do {
        pIVar8 = (pIVar16->Hooks).Data;
        if (*(int *)(pIVar8 + lVar44) == 1) {
          (**(code **)(pIVar8 + lVar44 + 8))(pIVar16,pIVar8 + lVar44);
          iVar32 = (pIVar16->Hooks).Size;
        }
        lVar47 = lVar47 + 1;
        lVar44 = lVar44 + 0x18;
      } while (lVar47 < iVar32);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0xf7d,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList._ResetForNewFrame();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList._ResetForNewFrame();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}